

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O1

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateTag(HtmlparserCppTest *this,string *expected_tag)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  bool bVar2;
  int iVar3;
  long lVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Alloc_hider _Var7;
  HtmlparserCppTest *pHVar8;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char *extraout_RAX;
  _Base_ptr this_00;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  int *piVar9;
  HtmlParser *this_01;
  const_iterator cVar10;
  mapped_type *ppHVar11;
  undefined8 extraout_RAX_02;
  undefined7 uVar12;
  ulong uVar13;
  htmlparser_ctx *phVar14;
  undefined1 *puVar15;
  undefined1 *puVar16;
  HtmlparserCppTest *pHVar17;
  string *psVar18;
  _Base_ptr __s1;
  htmlparser_ctx_s *phVar19;
  pointer this_02;
  _Base_ptr unaff_R12;
  pointer str_00;
  _Base_ptr unaff_R15;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_210;
  _Base_ptr p_Stack_1f8;
  _Base_ptr p_Stack_1f0;
  undefined1 auStack_1b0 [16];
  _Base_ptr p_Stack_1a0;
  _Base_ptr p_Stack_198;
  _Base_ptr p_Stack_190;
  undefined1 auStack_188 [16];
  _Base_ptr p_Stack_178;
  _Base_ptr p_Stack_170;
  _Base_ptr p_Stack_168;
  char *pcStack_160;
  HtmlParser HStack_158;
  allocator aStack_119;
  HtmlparserCppTest *pHStack_118;
  _Base_ptr p_Stack_110;
  HtmlparserCppTest HStack_108;
  HtmlparserCppTest *pHStack_c8;
  ulong uStack_c0;
  _Base_ptr p_Stack_b0;
  allocator aStack_99;
  _Alloc_hider _Stack_98;
  _Base_ptr p_Stack_90;
  undefined1 auStack_88 [40];
  _Alloc_hider _Stack_60;
  HtmlParser HStack_58;
  undefined1 auStack_50 [40];
  string *psStack_28;
  HtmlparserCppTest *pHStack_20;
  
  psVar18 = (string *)(this->parser_).parser_;
  pHStack_20 = (HtmlparserCppTest *)0x106fcf;
  p_Var5 = (_Base_ptr)expected_tag;
  lVar4 = ctemplate_htmlparser::htmlparser_tag((htmlparser_ctx_s *)psVar18);
  if (lVar4 == 0) {
    pHStack_20 = (HtmlparserCppTest *)0x106ff9;
    ValidateTag();
  }
  else {
    pHStack_20 = (HtmlparserCppTest *)0x106fdd;
    p_Var5 = (_Base_ptr)ctemplate_htmlparser::htmlparser_tag((this->parser_).parser_);
    pHStack_20 = (HtmlparserCppTest *)0x106fe8;
    psVar18 = expected_tag;
    iVar3 = std::__cxx11::string::compare((char *)expected_tag);
    if (iVar3 == 0) {
      return;
    }
  }
  pHStack_20 = (HtmlparserCppTest *)ValidateAttribute;
  ValidateTag();
  this_00 = (_Base_ptr)psVar18[1].field_2._M_allocated_capacity;
  auStack_50._24_8_ = 0x107011;
  p_Var6 = p_Var5;
  psStack_28 = expected_tag;
  pHStack_20 = this;
  lVar4 = ctemplate_htmlparser::htmlparser_attr((htmlparser_ctx_s *)this_00);
  if (lVar4 == 0) {
    auStack_50._24_8_ = 0x10703b;
    ValidateAttribute();
  }
  else {
    auStack_50._24_8_ = 0x10701f;
    p_Var6 = (_Base_ptr)
             ctemplate_htmlparser::htmlparser_attr
                       ((htmlparser_ctx_s *)psVar18[1].field_2._M_allocated_capacity);
    auStack_50._24_8_ = 0x10702a;
    this_00 = p_Var5;
    iVar3 = std::__cxx11::string::compare((char *)p_Var5);
    if (iVar3 == 0) {
      return;
    }
  }
  auStack_50._24_8_ = ValidateValue;
  ValidateAttribute();
  __s1 = (_Base_ptr)
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&this_00[1]._M_left)->_M_allocated_capacity;
  auStack_88._24_8_ = (_Base_ptr)0x107056;
  _Var7._M_p = (pointer)p_Var6;
  auStack_50._16_8_ = p_Var5;
  auStack_50._24_8_ = psVar18;
  lVar4 = ctemplate_htmlparser::htmlparser_value((htmlparser_ctx_s *)__s1);
  if (lVar4 != 0) {
    auStack_88._24_8_ = (_Base_ptr)0x107064;
    _Var7._M_p = (pointer)ctemplate_htmlparser::htmlparser_value
                                    ((htmlparser_ctx_s *)
                                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)&this_00[1]._M_left)->_M_allocated_capacity);
    this_00 = (_Base_ptr)&_Stack_60;
    auStack_88._24_8_ = (_Base_ptr)0x107079;
    __s1 = this_00;
    std::__cxx11::string::string((string *)this_00,_Var7._M_p,(allocator *)(auStack_88 + 0x27));
    p_Var5 = p_Var6->_M_parent;
    if (p_Var5 == (_Base_ptr)HStack_58.parser_) {
      if (p_Var5 == (_Base_ptr)0x0) {
LAB_00107099:
        if ((string *)_Stack_60._M_p != (string *)auStack_50) {
          auStack_88._24_8_ = (_Base_ptr)0x1070ac;
          operator_delete(_Stack_60._M_p);
        }
        return;
      }
      __s1 = *(_Base_ptr *)p_Var6;
      auStack_88._24_8_ = (_Base_ptr)0x107095;
      _Var7._M_p = _Stack_60._M_p;
      iVar3 = bcmp(__s1,_Stack_60._M_p,(size_t)p_Var5);
      if (iVar3 == 0) goto LAB_00107099;
    }
    auStack_88._24_8_ = (_Base_ptr)0x1070b9;
    ValidateValue();
  }
  auStack_88._24_8_ = ValidateAttributeType;
  ValidateValue();
  auStack_88._24_8_ = this_00;
  auStack_88._16_8_ = p_Var6;
  pHVar17 = *(HtmlparserCppTest **)&__s1[1]._M_left;
  iVar3 = ctemplate_htmlparser::htmlparser_attr_type((htmlparser_ctx_s *)pHVar17);
  puVar15 = kAttributeTypeMap;
  pHVar8 = (HtmlparserCppTest *)IdToName(pHVar17,(IdNameMap *)kAttributeTypeMap,iVar3);
  if (((_Base_ptr)_Var7._M_p)->_M_parent == (_Base_ptr)0x0) {
    ValidateAttributeType();
  }
  else {
    this_00 = (_Base_ptr)&_Stack_98;
    std::__cxx11::string::string((string *)this_00,(char *)pHVar8,&aStack_99);
    p_Var5 = ((_Base_ptr)_Var7._M_p)->_M_parent;
    puVar15 = (undefined1 *)pHVar8;
    if (p_Var5 == p_Stack_90) {
      uVar12 = (undefined7)((ulong)_Var7._M_p >> 8);
      if (p_Var5 == (_Base_ptr)0x0) {
        _Var7._M_p = (pointer)CONCAT71(uVar12,1);
      }
      else {
        puVar15 = _Stack_98._M_p;
        iVar3 = bcmp(*(void **)_Var7._M_p,_Stack_98._M_p,(size_t)p_Var5);
        _Var7._M_p = (pointer)CONCAT71(uVar12,iVar3 == 0);
      }
    }
    else {
      _Var7._M_p = (pointer)0x0;
    }
    if ((HtmlparserCppTest *)_Stack_98._M_p != (HtmlparserCppTest *)auStack_88) {
      operator_delete(_Stack_98._M_p);
    }
    pHVar17 = (HtmlparserCppTest *)_Stack_98._M_p;
    if ((char)_Var7._M_p != '\0') {
      return;
    }
  }
  ValidateAttributeType();
  uStack_c0 = 0x10715c;
  p_Stack_b0 = (_Base_ptr)_Var7._M_p;
  bVar2 = StringToBool((string *)puVar15);
  uVar13 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
  phVar19 = (pHVar17->parser_).parser_;
  uStack_c0 = 0x107167;
  iVar3 = ctemplate_htmlparser::htmlparser_is_attr_quoted(phVar19);
  if (SUB81(uVar13,0) == (iVar3 != 0)) {
    return;
  }
  uStack_c0 = 0x10717d;
  ValidateAttributeQuoted();
  HStack_108.parser_.parser_ = (htmlparser_ctx *)0x10718c;
  pHStack_c8 = pHVar17;
  uStack_c0 = uVar13;
  bVar2 = StringToBool((string *)puVar15);
  phVar14 = (htmlparser_ctx *)(CONCAT71(extraout_var_00,bVar2) & 0xffffffff);
  p_Var5 = *(_Base_ptr *)(phVar19 + 0x30);
  HStack_108.parser_.parser_ = (htmlparser_ctx *)0x107197;
  iVar3 = ctemplate_htmlparser::htmlparser_in_js((htmlparser_ctx_s *)p_Var5);
  if (SUB81(phVar14,0) == (iVar3 != 0)) {
    return;
  }
  HStack_108.parser_.parser_ = (htmlparser_ctx *)0x1071ad;
  ValidateInJavascript();
  HStack_108.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071bc;
  HStack_108.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)phVar19;
  HStack_108.parser_.parser_ = phVar14;
  bVar2 = StringToBool((string *)puVar15);
  p_Var6 = p_Var5[1]._M_left;
  HStack_108.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071c7;
  iVar3 = ctemplate_htmlparser::htmlparser_is_js_quoted((htmlparser_ctx_s *)p_Var6);
  if (bVar2 == (iVar3 != 0)) {
    return;
  }
  HStack_108.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071dd;
  ValidateJavascriptQuoted();
  pHVar17 = (HtmlparserCppTest *)p_Var6[1]._M_left;
  HStack_108.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var5;
  HStack_108.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = this_00;
  iVar3 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar17);
  puVar16 = kJavascriptStateMap;
  pHVar8 = (HtmlparserCppTest *)IdToName(pHVar17,(IdNameMap *)kJavascriptStateMap,iVar3);
  if (*(long *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    ValidateJavascriptState();
  }
  else {
    this_00 = (_Base_ptr)&pHStack_118;
    std::__cxx11::string::string((string *)this_00,(char *)pHVar8,&aStack_119);
    p_Var5 = *(_Base_ptr *)
              &(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl.super__Rb_tree_header.
               _M_header;
    puVar16 = (undefined1 *)pHVar8;
    if (p_Var5 == p_Stack_110) {
      if (p_Var5 == (_Base_ptr)0x0) {
        bVar2 = true;
      }
      else {
        puVar16 = (undefined1 *)pHStack_118;
        iVar3 = bcmp(*(pointer *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl,
                     pHStack_118,(size_t)p_Var5);
        bVar2 = iVar3 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if (pHStack_118 != &HStack_108) {
      operator_delete(pHStack_118);
    }
    pHVar17 = pHStack_118;
    if (bVar2) {
      return;
    }
  }
  ValidateJavascriptState();
  bVar2 = StringToBool((string *)puVar16);
  p_Var5 = (_Base_ptr)(pHVar17->parser_).parser_;
  iVar3 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)p_Var5);
  if (bVar2 == (iVar3 != 0)) {
    return;
  }
  ValidateInCss();
  pHVar8 = (HtmlparserCppTest *)&pcStack_160;
  HStack_158.parser_ = (htmlparser_ctx *)pHVar17;
  if (*(long *)&(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar2 = false;
    p_Var6 = p_Var5;
  }
  else {
    p_Stack_168 = (_Base_ptr)0x1072b8;
    pcStack_160 = extraout_RAX;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var6 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl;
    p_Stack_168 = (_Base_ptr)0x1072d4;
    this_00 = (_Base_ptr)strtol((char *)p_Var6,&pcStack_160,10);
    puVar16 = (undefined1 *)pHVar8;
    if (*pcStack_160 == '\0') {
      bVar2 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)&pcStack_160;
    }
    else {
      bVar2 = false;
      unaff_R12 = (_Base_ptr)&pcStack_160;
    }
  }
  if (bVar2) {
    p_Var6 = p_Var5[1]._M_left;
    p_Stack_168 = (_Base_ptr)0x1072fc;
    iVar3 = ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)p_Var6);
    if ((int)this_00 == iVar3) {
      return;
    }
  }
  else {
    p_Stack_168 = (_Base_ptr)0x107312;
    ValidateLine();
  }
  p_Stack_168 = (_Base_ptr)0x107317;
  ValidateLine();
  pHVar17 = (HtmlparserCppTest *)auStack_188;
  auStack_188._8_8_ = p_Var5;
  p_Stack_178 = unaff_R12;
  p_Stack_170 = this_00;
  p_Stack_168 = unaff_R15;
  if (*(long *)&(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar2 = false;
    p_Var5 = p_Var6;
  }
  else {
    p_Stack_190 = (_Base_ptr)0x107332;
    auStack_188._0_8_ = extraout_RAX_00;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var5 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl;
    p_Stack_190 = (_Base_ptr)0x10734e;
    this_00 = (_Base_ptr)strtol((char *)p_Var5,(char **)auStack_188,10);
    puVar16 = (undefined1 *)pHVar17;
    if (*(char *)auStack_188._0_8_ == '\0') {
      bVar2 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)auStack_188;
    }
    else {
      bVar2 = false;
      unaff_R12 = (_Base_ptr)auStack_188;
    }
  }
  if (bVar2) {
    p_Var5 = p_Var6[1]._M_left;
    p_Stack_190 = (_Base_ptr)0x107376;
    iVar3 = ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)p_Var5);
    if ((int)this_00 == iVar3) {
      return;
    }
  }
  else {
    p_Stack_190 = (_Base_ptr)0x10738c;
    ValidateColumn();
  }
  p_Stack_190 = (_Base_ptr)0x107391;
  ValidateColumn();
  pHVar17 = (HtmlparserCppTest *)auStack_1b0;
  auStack_1b0._8_8_ = p_Var6;
  p_Stack_1a0 = unaff_R12;
  p_Stack_198 = this_00;
  p_Stack_190 = unaff_R15;
  if (*(long *)&(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar2 = false;
    p_Var6 = p_Var5;
  }
  else {
    auStack_1b0._0_8_ = extraout_RAX_01;
    piVar9 = __errno_location();
    *piVar9 = 0;
    p_Var6 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl;
    this_00 = (_Base_ptr)strtol((char *)p_Var6,(char **)auStack_1b0,10);
    puVar16 = (undefined1 *)pHVar17;
    if (*(char *)auStack_1b0._0_8_ == '\0') {
      bVar2 = *piVar9 == 0;
      unaff_R12 = (_Base_ptr)auStack_1b0;
    }
    else {
      bVar2 = false;
      unaff_R12 = (_Base_ptr)auStack_1b0;
    }
  }
  if (bVar2) {
    p_Var6 = p_Var5[1]._M_left;
    iVar3 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)p_Var6);
    if ((int)this_00 == iVar3) {
      return;
    }
  }
  else {
    ValidateValueIndex();
  }
  ValidateValueIndex();
  bVar2 = StringToBool((string *)puVar16);
  pHVar17 = (HtmlparserCppTest *)p_Var6[1]._M_left;
  iVar3 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar17);
  if (bVar2 == (iVar3 != 0)) {
    return;
  }
  ValidateIsUrlStart();
  vStack_210.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_210.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_210.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Stack_1f8 = p_Var6;
  p_Stack_1f0 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)puVar16,"=",",",&vStack_210);
  if (vStack_210.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_210.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(pHVar17->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_210.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar3 = std::__cxx11::string::compare((char *)str_00);
      if (iVar3 == 0) {
        ValidateState(pHVar17,str);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)str_00);
        if (iVar3 == 0) {
          ValidateTag(pHVar17,str);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)str_00);
          if (iVar3 == 0) {
            ValidateAttribute(pHVar17,str);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)str_00);
            if (iVar3 == 0) {
              ValidateValue(pHVar17,str);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)str_00);
              if (iVar3 == 0) {
                ValidateAttributeType(pHVar17,str);
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)str_00);
                if (iVar3 == 0) {
                  ValidateAttributeQuoted(pHVar17,str);
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar3 == 0) {
                    ValidateInJavascript(pHVar17,str);
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar3 == 0) {
                      ValidateJavascriptQuoted(pHVar17,str);
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar3 == 0) {
                        ValidateJavascriptState(pHVar17,str);
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar3 == 0) {
                          ValidateInCss(pHVar17,str);
                        }
                        else {
                          iVar3 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar3 == 0) {
                            ValidateLine(pHVar17,str);
                          }
                          else {
                            iVar3 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar3 == 0) {
                              ValidateColumn(pHVar17,str);
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar3 == 0) {
                                ValidateValueIndex(pHVar17,str);
                              }
                              else {
                                iVar3 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar3 == 0) {
                                  ValidateIsUrlStart(pHVar17,str);
                                }
                                else {
                                  iVar3 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar3 == 0) {
                                    cVar10 = std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                             ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar17,str);
                                    if ((_Rb_tree_header *)cVar10._M_node == p_Var1) {
                                      this_01 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_01);
                                      ppHVar11 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar17->contextMap,str);
                                      *ppHVar11 = this_01;
                                    }
                                    ppHVar11 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::operator[](&pHVar17->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar11,&pHVar17->parser_);
                                  }
                                  else {
                                    iVar3 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar3 == 0) {
                                      cVar10 = std::
                                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar17,str);
                                      if ((_Rb_tree_header *)cVar10._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_0010784b:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_210);
                                        _Unwind_Resume(extraout_RAX_02);
                                      }
                                      ppHVar11 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar17->contextMap,str);
                                      HtmlParser::CopyFrom(&pHVar17->parser_,*ppHVar11);
                                    }
                                    else {
                                      iVar3 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar3 == 0) {
                                        bVar2 = StringToBool(str);
                                        if (bVar2) {
                                          ctemplate_htmlparser::htmlparser_reset
                                                    ((pHVar17->parser_).parser_);
                                        }
                                      }
                                      else {
                                        this_02 = str_00;
                                        iVar3 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar3 == 0) {
                                          iVar3 = NameToId((HtmlparserCppTest *)this_02,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    ((pHVar17->parser_).parser_,iVar3);
                                        }
                                        else {
                                          iVar3 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar3 != 0) goto LAB_0010784b;
                                          bVar2 = StringToBool(str);
                                          if (bVar2) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      ((pHVar17->parser_).parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_210.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_210);
  return;
}

Assistant:

void HtmlparserCppTest::ValidateTag(const string &expected_tag) {
  EXPECT_TRUE(parser_.tag() != NULL);
  EXPECT_TRUE(expected_tag == parser_.tag())
      << "Unexpected attr tag name at line " << parser_.line_number();
}